

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestGeodesicArcIntersect.cpp
# Opt level: O0

bool ParseTestGeodesicArcIntersect(string *sString)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  syntax_option_type __f;
  int iVar6;
  value_type *pvVar7;
  char *pcVar8;
  ostream *poVar9;
  bool local_f32;
  string local_da0;
  double local_d80;
  double dLon_1;
  double local_d58;
  double dLat_1;
  double local_d30;
  double dLon;
  double local_d08;
  double dLat;
  undefined1 local_cf8 [8];
  string sIntPt2Lon;
  undefined1 local_cd0 [8];
  string sIntPt2Lat;
  undefined1 local_ca8 [8];
  string sIntPt1Lon;
  undefined1 local_c80 [8];
  string sIntPt1Lat;
  LLPoint pt;
  string local_c48;
  string local_c28;
  int local_c04;
  undefined1 auStack_c00 [4];
  int nIndex;
  LLPoint intPtC2;
  LLPoint intPtC1;
  string local_bc0;
  string local_ba0;
  string local_b80;
  undefined1 local_b60 [8];
  LLPoint intersection2;
  LLPoint intersection1;
  double arcRadius;
  double geodesicAzimuth;
  string local_b10;
  undefined1 local_af0 [8];
  LLPoint arcCenter;
  string local_ac0;
  undefined1 local_aa0 [8];
  LLPoint geodesicStart;
  regex_error *e;
  string_type local_9f8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_9d8;
  string_type local_950;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_930;
  string_type local_8a8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_888;
  string_type local_800;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_7e0;
  string_type local_758;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_738;
  string_type local_6b0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_690;
  string_type local_608;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_5e8;
  string_type local_560;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_540;
  string_type local_4b8;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_498;
  string_type local_410;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_3f0;
  string_type local_368;
  undefined1 local_348 [8];
  sregex_token_iterator s_end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  undefined1 local_2a0 [8];
  sregex_token_iterator it;
  int sub_matches [13];
  regex pat;
  undefined1 local_1b8 [8];
  string sRxPat;
  string local_180 [4];
  syntax_option_type flags;
  string soIntersection2Lon;
  string soIntersection2Lat;
  string soIntersection1Lon;
  string soIntersection1Lat;
  string soArcRadius;
  string soArcCenterLon;
  string soArcCenterLat;
  string soGeodesicAzimuth;
  string soGeodesicStartLon;
  string soGeodesicStartLat;
  string soTestId;
  bool bPassed;
  string *sString_local;
  
  soTestId.field_2._M_local_buf[0xf] = '\x01';
  trim(sString," \t\n\r\f\v");
  std::__cxx11::string::string((string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soGeodesicStartLon.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soGeodesicAzimuth.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soArcCenterLat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soArcCenterLon.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soArcRadius.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soIntersection1Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soIntersection1Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soIntersection2Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(soIntersection2Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_180);
  __f = std::regex_constants::operator|(1,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1b8,"([a-z]*|[A-Z]*\\d*)[,]",
             (allocator *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::operator+=
            ((string *)local_1b8,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=((string *)local_1b8,"([-+]?[0-9]*[.]?[0-9]+)[,]");
  std::__cxx11::string::operator+=
            ((string *)local_1b8,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]")
  ;
  std::__cxx11::string::operator+=((string *)local_1b8,"([-+]?[0-9]*[.]?[0-9]+)[,]");
  std::__cxx11::string::operator+=
            ((string *)local_1b8,
             "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]"
            );
  std::__cxx11::string::operator+=
            ((string *)local_1b8,
             "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])"
            );
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)(sub_matches + 0xc),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,__f);
  sub_matches[6] = 9;
  sub_matches[7] = 10;
  sub_matches[8] = 0xb;
  sub_matches[9] = 0xc;
  sub_matches[2] = 5;
  sub_matches[3] = 6;
  sub_matches[4] = 7;
  sub_matches[5] = 8;
  it._M_has_m1 = true;
  it._129_7_ = 0x2000000;
  sub_matches[0] = 3;
  sub_matches[1] = 4;
  sub_matches[10] = 0xd;
  local_2b0._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_2a8,&local_2b0);
  s_end._128_8_ = std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_2b8,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&s_end._M_has_m1);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<13ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)local_2a0,local_2a8,local_2b8,(regex_type *)(sub_matches + 0xc),
             (int (*) [13])&it._M_has_m1,0);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_348);
  bVar5 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_2a0,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_348);
  if (bVar5) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3f0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_3f0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_368,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soGeodesicStartLat.field_2._M_local_buf + 8),(string *)&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3f0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_498,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_498);
    std::__cxx11::sub_match::operator_cast_to_string(&local_410,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soGeodesicStartLon.field_2._M_local_buf + 8),(string *)&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_498);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_540,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_540);
    std::__cxx11::sub_match::operator_cast_to_string(&local_4b8,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soGeodesicAzimuth.field_2._M_local_buf + 8),(string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_540);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_5e8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_5e8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_560,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soArcCenterLat.field_2._M_local_buf + 8),(string *)&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_5e8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_690,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_690);
    std::__cxx11::sub_match::operator_cast_to_string(&local_608,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soArcCenterLon.field_2._M_local_buf + 8),(string *)&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_690);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_738,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_738);
    std::__cxx11::sub_match::operator_cast_to_string(&local_6b0,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soArcRadius.field_2._M_local_buf + 8),(string *)&local_6b0);
    std::__cxx11::string::~string((string *)&local_6b0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_738);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_7e0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_7e0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_758,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soIntersection1Lat.field_2._M_local_buf + 8),(string *)&local_758);
    std::__cxx11::string::~string((string *)&local_758);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_7e0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_888,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_888);
    std::__cxx11::sub_match::operator_cast_to_string(&local_800,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soIntersection1Lon.field_2._M_local_buf + 8),(string *)&local_800);
    std::__cxx11::string::~string((string *)&local_800);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_888);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_930,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_930);
    std::__cxx11::sub_match::operator_cast_to_string(&local_8a8,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soIntersection2Lat.field_2._M_local_buf + 8),(string *)&local_8a8);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_930);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_9d8,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_9d8);
    std::__cxx11::sub_match::operator_cast_to_string(&local_950,(sub_match *)pvVar7);
    std::__cxx11::string::operator=
              ((string *)(soIntersection2Lon.field_2._M_local_buf + 8),(string *)&local_950);
    std::__cxx11::string::~string((string *)&local_950);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_9d8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&e,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_2a0,0);
    pvVar7 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)&e);
    std::__cxx11::sub_match::operator_cast_to_string(&local_9f8,(sub_match *)pvVar7);
    std::__cxx11::string::operator=(local_180,(string *)&local_9f8);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&e);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_348);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_2a0);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(sub_matches + 0xc));
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::string
            ((string *)&local_ac0,(string *)(soGeodesicStartLon.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_ac0);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string
            ((string *)&arcCenter.longitude,(string *)(soGeodesicAzimuth.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude((string *)&arcCenter.longitude);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_aa0,dVar1,dVar2);
  std::__cxx11::string::~string((string *)&arcCenter.longitude);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::__cxx11::string::string
            ((string *)&local_b10,(string *)(soArcCenterLon.field_2._M_local_buf + 8));
  dVar1 = ParseLatitude(&local_b10);
  dVar1 = Deg2Rad(dVar1);
  std::__cxx11::string::string
            ((string *)&geodesicAzimuth,(string *)(soArcRadius.field_2._M_local_buf + 8));
  dVar2 = ParseLongitude((string *)&geodesicAzimuth);
  dVar2 = Deg2Rad(dVar2);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_af0,dVar1,dVar2);
  std::__cxx11::string::~string((string *)&geodesicAzimuth);
  std::__cxx11::string::~string((string *)&local_b10);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  dVar1 = atof(pcVar8);
  dVar1 = Deg2Rad(dVar1);
  pcVar8 = (char *)std::__cxx11::string::c_str();
  dVar2 = atof(pcVar8);
  dVar2 = NmToMeters(dVar2);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)&intersection2.longitude);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)local_b60);
  bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&soIntersection1Lon.field_2 + 8),"N/A");
  if (bVar5) {
    std::__cxx11::string::string
              ((string *)&local_b80,(string *)(soIntersection1Lon.field_2._M_local_buf + 8));
    dVar4 = ParseLatitude(&local_b80);
    dVar4 = Deg2Rad(dVar4);
    std::__cxx11::string::string
              ((string *)&local_ba0,(string *)(soIntersection2Lat.field_2._M_local_buf + 8));
    dVar3 = ParseLongitude(&local_ba0);
    dVar3 = Deg2Rad(dVar3);
    GeoCalcs::LLPOINT::Set((LLPOINT *)&intersection2.longitude,dVar4,dVar3);
    std::__cxx11::string::~string((string *)&local_ba0);
    std::__cxx11::string::~string((string *)&local_b80);
    std::__cxx11::string::string
              ((string *)&local_bc0,(string *)(soIntersection2Lon.field_2._M_local_buf + 8));
    dVar4 = ParseLatitude(&local_bc0);
    dVar4 = Deg2Rad(dVar4);
    std::__cxx11::string::string((string *)&intPtC1.longitude,local_180);
    dVar3 = ParseLongitude((string *)&intPtC1.longitude);
    dVar3 = Deg2Rad(dVar3);
    GeoCalcs::LLPOINT::Set((LLPOINT *)local_b60,dVar4,dVar3);
    std::__cxx11::string::~string((string *)&intPtC1.longitude);
    std::__cxx11::string::~string((string *)&local_bc0);
  }
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)&intPtC2.longitude);
  GeoCalcs::LLPOINT::LLPOINT((LLPOINT *)auStack_c00);
  local_c04 = GeoCalcs::GeodesicArcIntercept
                        ((LLPoint *)local_aa0,dVar1,(LLPoint *)local_af0,dVar2,
                         (LLPoint *)&intPtC2.longitude,(LLPoint *)auStack_c00,1e-09);
  dVar1 = intPtC2.longitude;
  if (local_c04 < 1) {
    bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&soIntersection1Lon.field_2 + 8),"N/A");
    soTestId.field_2._M_local_buf[0xf] = !bVar5;
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_c28,(string *)(soIntersection2Lon.field_2._M_local_buf + 8));
    dVar2 = ParseLatitude(&local_c28);
    dVar2 = Deg2Rad(dVar2);
    dVar4 = Deg2Rad(0.1);
    bVar5 = IsApprox(dVar1,dVar2,dVar4);
    dVar1 = intPtC1.latitude;
    local_f32 = false;
    if (bVar5) {
      std::__cxx11::string::string((string *)&local_c48,local_180);
      dVar2 = ParseLongitude(&local_c48);
      dVar2 = Deg2Rad(dVar2);
      dVar4 = Deg2Rad(0.1);
      local_f32 = IsApprox(dVar1,dVar2,dVar4);
      std::__cxx11::string::~string((string *)&local_c48);
    }
    std::__cxx11::string::~string((string *)&local_c28);
    dVar2 = intPtC1.latitude;
    dVar1 = intPtC2.longitude;
    if (local_f32 != false) {
      sIntPt1Lat.field_2._8_8_ = intPtC2.longitude;
      intPtC2.longitude = _auStack_c00;
      intPtC1.latitude = intPtC2.latitude;
      _auStack_c00 = dVar1;
      intPtC2.latitude = dVar2;
    }
    sIntPt1Lon.field_2._8_8_ = Rad2Deg(intPtC2.longitude);
    ConvertLatitudeDdToDms_abi_cxx11_((string *)local_c80,(double *)((long)&sIntPt1Lon.field_2 + 8))
    ;
    sIntPt2Lat.field_2._8_8_ = Rad2Deg(intPtC1.latitude);
    ConvertLongitudeDdToDms_abi_cxx11_
              ((string *)local_ca8,(double *)((long)&sIntPt2Lat.field_2 + 8));
    sIntPt2Lon.field_2._8_8_ = Rad2Deg(_auStack_c00);
    ConvertLatitudeDdToDms_abi_cxx11_((string *)local_cd0,(double *)((long)&sIntPt2Lon.field_2 + 8))
    ;
    dLat = Rad2Deg(intPtC2.latitude);
    ConvertLongitudeDdToDms_abi_cxx11_((string *)local_cf8,&dLat);
    iVar6 = std::__cxx11::string::compare((string *)local_c80);
    if (iVar6 != 0) {
      std::__cxx11::string::string
                ((string *)&dLon,(string *)(soIntersection1Lon.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude((string *)&dLon);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::~string((string *)&dLon);
      local_d08 = dVar1;
      soTestId.field_2._M_local_buf[0xf] = IsApprox(dVar1,intPtC2.longitude,1e-10);
      if ((bool)soTestId.field_2._M_local_buf[0xf]) {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,
                                 " within rounding tolerance of 1e-10: Input Intersection 1 latitude: "
                                );
        poVar9 = std::operator<<(poVar9,(string *)(soIntersection1Lon.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,(string *)local_c80);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9," failed: Expected Intersection 1 latitude: ");
        poVar9 = std::operator<<(poVar9,(string *)(soIntersection1Lon.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,(string *)local_c80);
      }
    }
    iVar6 = std::__cxx11::string::compare((string *)local_ca8);
    if (iVar6 != 0) {
      std::__cxx11::string::string
                ((string *)&dLat_1,(string *)(soIntersection2Lat.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude((string *)&dLat_1);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::~string((string *)&dLat_1);
      local_d30 = dVar1;
      bVar5 = IsApprox(dVar1,intPtC1.latitude,1e-10);
      if (bVar5) {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,
                                 " within rounding tolerance of 1e-10: Input Intersection 1 longitude: "
                                );
        poVar9 = std::operator<<(poVar9,(string *)(soIntersection2Lat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,(string *)local_ca8);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9," failed: Expected Intersection 1 longitude: ");
        poVar9 = std::operator<<(poVar9,(string *)(soIntersection2Lat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,(string *)local_ca8);
        soTestId.field_2._M_local_buf[0xf] = '\0';
      }
    }
    iVar6 = std::__cxx11::string::compare((string *)local_cd0);
    if (iVar6 != 0) {
      std::__cxx11::string::string
                ((string *)&dLon_1,(string *)(soIntersection2Lon.field_2._M_local_buf + 8));
      dVar1 = ParseLatitude((string *)&dLon_1);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::~string((string *)&dLon_1);
      local_d58 = dVar1;
      bVar5 = IsApprox(dVar1,_auStack_c00,1e-10);
      if (bVar5) {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,
                                 " within rounding tolerance of 1e-10: Input Intersection 2 latitude: "
                                );
        poVar9 = std::operator<<(poVar9,(string *)(soIntersection2Lon.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,(string *)local_cd0);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9," failed: Expected Intersection 2 latitude: ");
        poVar9 = std::operator<<(poVar9,(string *)(soIntersection2Lon.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,(string *)local_cd0);
        soTestId.field_2._M_local_buf[0xf] = '\0';
      }
    }
    iVar6 = std::__cxx11::string::compare((string *)local_cf8);
    if (iVar6 != 0) {
      std::__cxx11::string::string((string *)&local_da0,local_180);
      dVar1 = ParseLatitude(&local_da0);
      dVar1 = Deg2Rad(dVar1);
      std::__cxx11::string::~string((string *)&local_da0);
      local_d80 = dVar1;
      bVar5 = IsApprox(dVar1,intPtC2.latitude,1e-10);
      if (bVar5) {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9,
                                 " within rounding tolerance of 1e-10: Input Intersection 2 longitude: "
                                );
        poVar9 = std::operator<<(poVar9,local_180);
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,(string *)local_cf8);
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"\n");
        poVar9 = std::operator<<(poVar9,(string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
        poVar9 = std::operator<<(poVar9," failed: Expected Intersection 2 longitude: ");
        poVar9 = std::operator<<(poVar9,local_180);
        poVar9 = std::operator<<(poVar9,"  calced: ");
        std::operator<<(poVar9,(string *)local_cf8);
        soTestId.field_2._M_local_buf[0xf] = '\0';
      }
    }
    std::__cxx11::string::~string((string *)local_cf8);
    std::__cxx11::string::~string((string *)local_cd0);
    std::__cxx11::string::~string((string *)local_ca8);
    std::__cxx11::string::~string((string *)local_c80);
  }
  geodesicStart.longitude._4_4_ = 1;
  std::__cxx11::string::~string(local_180);
  std::__cxx11::string::~string((string *)(soIntersection2Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soIntersection2Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soIntersection1Lon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soIntersection1Lat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soArcRadius.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soArcCenterLon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soArcCenterLat.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soGeodesicAzimuth.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soGeodesicStartLon.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(soGeodesicStartLat.field_2._M_local_buf + 8));
  return (bool)soTestId.field_2._M_local_buf[0xf];
}

Assistant:

bool ParseTestGeodesicArcIntersect(string sString)
{
    bool bPassed = true;
    trim(sString);
    string soTestId, soGeodesicStartLat, soGeodesicStartLon;
    string soGeodesicAzimuth, soArcCenterLat, soArcCenterLon;
    string soArcRadius, soIntersection1Lat, soIntersection1Lon;
    string soIntersection2Lat, soIntersection2Lon;

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "([a-z]*|[A-Z]*\\d*)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])[,]";
        sRxPat += "([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([N/A]+|[0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";

        regex pat(sRxPat, flags);

        int const sub_matches[] = {1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13,};
        sregex_token_iterator it(sString.begin(), sString.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            soTestId = *it++;
            soGeodesicStartLat = *it++;
            soGeodesicStartLon = *it++;
            soGeodesicAzimuth = *it++;
            soArcCenterLat = *it++;
            soArcCenterLon = *it++;
            soArcRadius = *it++;
            soIntersection1Lat = *it++;
            soIntersection1Lon = *it++;
            soIntersection2Lat = *it++;
            soIntersection2Lon = *it++;

        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    LLPoint geodesicStart(Deg2Rad(ParseLatitude(soGeodesicStartLat)), Deg2Rad(ParseLongitude(soGeodesicStartLon)));
    LLPoint arcCenter(Deg2Rad(ParseLatitude(soArcCenterLat)), Deg2Rad(ParseLongitude(soArcCenterLon)));
    double geodesicAzimuth = Deg2Rad(atof(soGeodesicAzimuth.c_str()));
    double arcRadius = NmToMeters(atof(soArcRadius.c_str()));
    LLPoint intersection1;
    LLPoint intersection2;
    if (soIntersection1Lat != "N/A")
    {
        intersection1.Set(Deg2Rad(ParseLatitude(soIntersection1Lat)), Deg2Rad(ParseLongitude(soIntersection1Lon)));
        intersection2.Set(Deg2Rad(ParseLatitude(soIntersection2Lat)), Deg2Rad(ParseLongitude(soIntersection2Lon)));
    }

    LLPoint intPtC1, intPtC2;
    int nIndex = GeodesicArcIntercept(geodesicStart, geodesicAzimuth, arcCenter, arcRadius, intPtC1, intPtC2, kTol);
    if (nIndex < 1)
    {
        if (soIntersection1Lat != "N/A")
            bPassed = false;

    }
    else
    {
        if (IsApprox(intPtC1.latitude, Deg2Rad(ParseLatitude(soIntersection2Lat)), Deg2Rad(0.1)) &&
            IsApprox(intPtC1.longitude, Deg2Rad(ParseLongitude(soIntersection2Lon)), Deg2Rad(0.1)))
        {
            LLPoint pt = intPtC1;
            intPtC1 = intPtC2;
            intPtC2 = pt;
        }

        string sIntPt1Lat = ConvertLatitudeDdToDms(Rad2Deg(intPtC1.latitude));
        string sIntPt1Lon = ConvertLongitudeDdToDms(Rad2Deg(intPtC1.longitude));
        string sIntPt2Lat = ConvertLatitudeDdToDms(Rad2Deg(intPtC2.latitude));
        string sIntPt2Lon = ConvertLongitudeDdToDms(Rad2Deg(intPtC2.longitude));

        if (sIntPt1Lat.compare(soIntersection1Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(soIntersection1Lat));
            if (IsApprox(dLat, intPtC1.latitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 1 latitude: " <<
                soIntersection1Lat << "  calced: " << sIntPt1Lat;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 1 latitude: " << soIntersection1Lat <<
                "  calced: " << sIntPt1Lat;
                bPassed = false;
            }
        }

        if (sIntPt1Lon.compare(soIntersection1Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLatitude(soIntersection1Lon));
            if (IsApprox(dLon, intPtC1.longitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 1 longitude: " <<
                soIntersection1Lon << "  calced: " << sIntPt1Lon;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 1 longitude: " << soIntersection1Lon <<
                "  calced: " << sIntPt1Lon;
                bPassed = false;
            }
        }

        if (sIntPt2Lat.compare(soIntersection2Lat) != 0)
        {
            double dLat = Deg2Rad(ParseLatitude(soIntersection2Lat));
            if (IsApprox(dLat, intPtC2.latitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 2 latitude: " <<
                soIntersection2Lat << "  calced: " << sIntPt2Lat;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 2 latitude: " << soIntersection2Lat <<
                "  calced: " << sIntPt2Lat;
                bPassed = false;
            }
        }

        if (sIntPt2Lon.compare(soIntersection2Lon) != 0)
        {
            double dLon = Deg2Rad(ParseLatitude(soIntersection2Lon));
            if (IsApprox(dLon, intPtC2.longitude, 1e-10))
            {
                cout << "\n" << soTestId << " within rounding tolerance of 1e-10: Input Intersection 2 longitude: " <<
                soIntersection2Lon << "  calced: " << sIntPt2Lon;
            }
            else
            {
                cout << "\n" << soTestId << " failed: Expected Intersection 2 longitude: " << soIntersection2Lon <<
                "  calced: " << sIntPt2Lon;
                bPassed = false;
            }
        }

    }


    return bPassed;
}